

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_serve_static_content.cpp
# Opt level: O1

void __thiscall ServeStaticContent_Simple_Test::TestBody(ServeStaticContent_Simple_Test *this)

{
  long *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined8 uVar5;
  pointer pcVar6;
  error_code *peVar7;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *this_00;
  string *psVar8;
  istream *piVar9;
  error_category *peVar10;
  request_info *this_01;
  tuple<unsigned_long,_pstore::http::request_info> *ptVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  tuple<unsigned_long,_int> *ptVar13;
  char *pcVar14;
  char *in_R9;
  pointer *__ptr;
  error_code eVar15;
  AssertionResult gtest_ar;
  error_or_n<std::string::size_type,_int> eo;
  string uri;
  string method;
  string version;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  headers;
  reader r;
  error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> actual;
  istringstream is;
  AssertionResult gtest_ar_;
  char in_stack_fffffffffffff940;
  undefined7 in_stack_fffffffffffff941;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6b8;
  error_or<std::tuple<unsigned_long,_int>_> local_6b0;
  request_info local_698;
  undefined1 local_638 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_608;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_578;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_520;
  undefined1 local_518 [40];
  bool local_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4d8;
  undefined1 local_4b0 [384];
  undefined1 local_330 [104];
  bool local_2c8;
  _Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  
  plVar1 = (long *)(local_4b0 + 0x10);
  local_4b0._0_8_ = plVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"/index.html","");
  anon_unknown.dwarf_11e507::ServeStaticContent::serve_path
            (&local_4d8,&this->super_ServeStaticContent,(string *)local_4b0);
  if ((long *)local_4b0._0_8_ != plVar1) {
    operator_delete((void *)local_4b0._0_8_,local_4b0._16_8_ + 1);
  }
  local_330[0] = local_4d8.has_error_ ^ 1;
  local_330._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_4d8.has_error_ == false) {
    local_538.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_538.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_538.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_520 = pstore::error_or<std::__cxx11::string>::
                value_storage_impl<pstore::error_or<std::__cxx11::string>const&,std::__cxx11::string_const>
                          (&local_4d8);
    (anonymous_namespace)::reader::gets_abi_cxx11_((reader *)local_638,(char *)&local_520);
    if ((bool)local_608._M_local_buf[0] == false) {
      this_00 = (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                 *)pstore::
                   error_or<std::tuple<unsigned_long,pstore::maybe<std::__cxx11::string,void>>>::
                   value_storage_impl<pstore::error_or<std::tuple<unsigned_long,pstore::maybe<std::__cxx11::string,void>>>const&,std::tuple<unsigned_long,pstore::maybe<std::__cxx11::string,void>>const>
                             ((error_or<std::tuple<unsigned_long,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
                               *)local_638);
      if (this_00->valid_ == false) {
        peVar10 = (error_category *)std::_V2::generic_category();
        local_4f0 = true;
        peVar7 = pstore::error_or<std::tuple<unsigned_long,std::__cxx11::string>>::
                 error_storage_impl<pstore::error_or<std::tuple<unsigned_long,std::__cxx11::string>>&,std::error_code>
                           ((error_or<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_518);
        peVar7->_M_value = 0x6b;
        peVar7->_M_cat = peVar10;
      }
      else {
        uVar5 = *(undefined8 *)(this_00 + 1);
        pbVar12 = pstore::
                  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                  ::operator->(this_00);
        local_4f0 = false;
        psVar8 = (string *)
                 pstore::error_or<std::tuple<unsigned_long,std::__cxx11::string>>::
                 value_storage_impl<pstore::error_or<std::tuple<unsigned_long,std::__cxx11::string>>&,std::tuple<unsigned_long,std::__cxx11::string>>
                           ((error_or<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_518);
        *(string **)psVar8 = psVar8 + 0x10;
        pcVar6 = (pbVar12->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>(psVar8,pcVar6,pcVar6 + pbVar12->_M_string_length);
        *(undefined8 *)(psVar8 + 0x20) = uVar5;
      }
    }
    else {
      eVar15 = pstore::
               error_or<std::tuple<unsigned_long,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
               ::get_error((error_or<std::tuple<unsigned_long,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
                            *)local_638);
      local_4f0 = true;
      peVar7 = pstore::error_or<std::tuple<unsigned_long,std::__cxx11::string>>::
               error_storage_impl<pstore::error_or<std::tuple<unsigned_long,std::__cxx11::string>>&,std::error_code>
                         ((error_or<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_518);
      peVar7->_M_value = eVar15._M_value;
      peVar7->_M_cat = eVar15._M_cat;
    }
    if (local_4f0 == false) {
      psVar8 = (string *)
               pstore::error_or<std::tuple<unsigned_long,std::__cxx11::string>>::
               value_storage_impl<pstore::error_or<std::tuple<unsigned_long,std::__cxx11::string>>const&,std::tuple<unsigned_long,std::__cxx11::string>const>
                         ((error_or<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_518);
      pcVar6 = *(pointer *)(psVar8 + 0x20);
      std::__cxx11::istringstream::istringstream((istringstream *)local_4b0,psVar8,_S_in);
      paVar2 = &local_5b8.first.field_2;
      local_5b8.first._M_string_length = 0;
      local_5b8.first.field_2._M_local_buf[0] = '\0';
      paVar3 = &local_5f8.first.field_2;
      local_5f8.first._M_string_length = 0;
      local_5f8.first.field_2._M_local_buf[0] = '\0';
      paVar4 = &local_578.first.field_2;
      local_578.first._M_string_length = 0;
      local_578.first.field_2._M_local_buf[0] = '\0';
      local_5f8.first._M_dataplus._M_p = (pointer)paVar3;
      local_5b8.first._M_dataplus._M_p = (pointer)paVar2;
      local_578.first._M_dataplus._M_p = (pointer)paVar4;
      piVar9 = std::operator>>((istream *)local_4b0,(string *)&local_5b8);
      piVar9 = std::operator>>(piVar9,(string *)&local_5f8);
      std::operator>>(piVar9,(string *)&local_578);
      if (((local_5b8.first._M_string_length == 0) || (local_5f8.first._M_string_length == 0)) ||
         (local_578.first._M_string_length == 0)) {
        peVar10 = (error_category *)std::_V2::generic_category();
        local_2c8 = true;
        peVar7 = pstore::error_or<std::tuple<unsigned_long,pstore::http::request_info>>::
                 error_storage_impl<pstore::error_or<std::tuple<unsigned_long,pstore::http::request_info>>&,std::error_code>
                           ((error_or<std::tuple<unsigned_long,_pstore::http::request_info>_> *)
                            local_330);
        peVar7->_M_value = 0x6b;
        peVar7->_M_cat = peVar10;
      }
      else {
        local_698.method_._M_dataplus._M_p = (pointer)&local_698.method_.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b8.first._M_dataplus._M_p == paVar2) {
          local_698.method_.field_2._8_8_ = local_5b8.first.field_2._8_8_;
        }
        else {
          local_698.method_._M_dataplus._M_p = local_5b8.first._M_dataplus._M_p;
        }
        local_698.method_.field_2._M_allocated_capacity._1_7_ =
             local_5b8.first.field_2._M_allocated_capacity._1_7_;
        local_698.method_.field_2._M_local_buf[0] = local_5b8.first.field_2._M_local_buf[0];
        local_698.uri_._M_dataplus._M_p = (pointer)&local_698.uri_.field_2;
        local_698.method_._M_string_length = local_5b8.first._M_string_length;
        local_5b8.first._M_string_length = 0;
        local_5b8.first.field_2._M_local_buf[0] = '\0';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f8.first._M_dataplus._M_p == paVar3) {
          local_698.uri_.field_2._8_8_ = local_5f8.first.field_2._8_8_;
        }
        else {
          local_698.uri_._M_dataplus._M_p = local_5f8.first._M_dataplus._M_p;
        }
        local_698.uri_.field_2._M_allocated_capacity._1_7_ =
             local_5f8.first.field_2._M_allocated_capacity._1_7_;
        local_698.uri_.field_2._M_local_buf[0] = local_5f8.first.field_2._M_local_buf[0];
        local_698.version_._M_dataplus._M_p = (pointer)&local_698.version_.field_2;
        local_698.uri_._M_string_length = local_5f8.first._M_string_length;
        local_5f8.first._M_string_length = 0;
        local_5f8.first.field_2._M_local_buf[0] = '\0';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578.first._M_dataplus._M_p == paVar4) {
          local_698.version_.field_2._8_8_ = local_578.first.field_2._8_8_;
        }
        else {
          local_698.version_._M_dataplus._M_p = local_578.first._M_dataplus._M_p;
        }
        local_698.version_.field_2._M_allocated_capacity._1_7_ =
             local_578.first.field_2._M_allocated_capacity._1_7_;
        local_698.version_.field_2._M_local_buf[0] = local_578.first.field_2._M_local_buf[0];
        local_698.version_._M_string_length = local_578.first._M_string_length;
        local_578.first._M_string_length = 0;
        local_578.first.field_2._M_local_buf[0] = '\0';
        local_2c8 = false;
        local_5f8.first._M_dataplus._M_p = (pointer)paVar3;
        local_5b8.first._M_dataplus._M_p = (pointer)paVar2;
        local_578.first._M_dataplus._M_p = (pointer)paVar4;
        this_01 = (request_info *)
                  pstore::error_or<std::tuple<unsigned_long,pstore::http::request_info>>::
                  value_storage_impl<pstore::error_or<std::tuple<unsigned_long,pstore::http::request_info>>&,std::tuple<unsigned_long,pstore::http::request_info>>
                            ((error_or<std::tuple<unsigned_long,_pstore::http::request_info>_> *)
                             local_330);
        pstore::http::request_info::request_info(this_01,&local_698);
        this_01[1].method_._M_dataplus._M_p = pcVar6;
        pstore::http::request_info::~request_info(&local_698);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578.first._M_dataplus._M_p != paVar4) {
        operator_delete(local_578.first._M_dataplus._M_p,
                        CONCAT71(local_578.first.field_2._M_allocated_capacity._1_7_,
                                 local_578.first.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8.first._M_dataplus._M_p != paVar3) {
        operator_delete(local_5f8.first._M_dataplus._M_p,
                        CONCAT71(local_5f8.first.field_2._M_allocated_capacity._1_7_,
                                 local_5f8.first.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_5b8.first._M_dataplus._M_p,
                        CONCAT71(local_5b8.first.field_2._M_allocated_capacity._1_7_,
                                 local_5b8.first.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_4b0);
      std::ios_base::~ios_base((ios_base *)(local_4b0 + 0x78));
    }
    else {
      eVar15 = pstore::
               error_or<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::get_error((error_or<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_518);
      local_2c8 = true;
      peVar7 = pstore::error_or<std::tuple<unsigned_long,pstore::http::request_info>>::
               error_storage_impl<pstore::error_or<std::tuple<unsigned_long,pstore::http::request_info>>&,std::error_code>
                         ((error_or<std::tuple<unsigned_long,_pstore::http::request_info>_> *)
                          local_330);
      peVar7->_M_value = eVar15._M_value;
      peVar7->_M_cat = eVar15._M_cat;
    }
    pstore::
    error_or<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~error_or((error_or<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_518);
    pstore::
    error_or<std::tuple<unsigned_long,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
    ::~error_or((error_or<std::tuple<unsigned_long,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
                 *)local_638);
    if (local_2c8 == false) {
      ptVar11 = pstore::error_or<std::tuple<unsigned_long,pstore::http::request_info>>::
                value_storage_impl<pstore::error_or<std::tuple<unsigned_long,pstore::http::request_info>>const&,std::tuple<unsigned_long,pstore::http::request_info>const>
                          ((error_or<std::tuple<unsigned_long,_pstore::http::request_info>_> *)
                           local_330);
      pstore::http::operator()
                (&local_6b0,(http *)&local_520,
                 (reader *)
                 (ptVar11->super__Tuple_impl<0UL,_unsigned_long,_pstore::http::request_info>).
                 super__Head_base<0UL,_unsigned_long,_false>._M_head_impl,(state_type)&local_538,
                 (anon_class_8_1_b2c1a266)0x0,(int)in_R9);
    }
    else {
      eVar15 = pstore::error_or<std::tuple<unsigned_long,_pstore::http::request_info>_>::get_error
                         ((error_or<std::tuple<unsigned_long,_pstore::http::request_info>_> *)
                          local_330);
      local_6b0.has_error_ = true;
      peVar7 = pstore::error_or<std::tuple<unsigned_long,int>>::
               error_storage_impl<pstore::error_or<std::tuple<unsigned_long,int>>&,std::error_code>
                         (&local_6b0);
      peVar7->_M_value = eVar15._M_value;
      peVar7->_M_cat = eVar15._M_cat;
    }
    pstore::error_or<std::tuple<unsigned_long,_pstore::http::request_info>_>::~error_or
              ((error_or<std::tuple<unsigned_long,_pstore::http::request_info>_> *)local_330);
    local_330[0] = local_6b0.has_error_ ^ 1;
    local_330._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_6b0.has_error_ == false) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[15],_const_char_(&)[3],_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_698,(char (*) [15])"content-length",(char (*) [3])0x1865f8);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[13],_const_char_(&)[10],_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_638,(char (*) [13])"content-type",(char (*) [10])"text/html");
      pcVar14 = "";
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[5],_const_char_(&)[1],_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_518,(char (*) [5])"date",(char (*) [1])0x18e093);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[11],_const_char_(&)[6],_true>
                (&local_5b8,(char (*) [11])"connection",(char (*) [6])0x18a6b4);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[14],_const_char_(&)[30],_true>
                (&local_5f8,(char (*) [14])"last-modified",
                 (char (*) [30])"Tue, 23 Apr 2019 09:10:27 GMT");
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[7],_const_char_(&)[12],_true>
                (&local_578,(char (*) [7])"server",(char (*) [12])"pstore-http");
      testing::
      UnorderedElementsAre<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_1b0,(testing *)&local_698,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_638,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_518,&local_5b8,&local_5f8,&local_578,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT71(in_stack_fffffffffffff941,in_stack_fffffffffffff940));
      std::
      _Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Tuple_impl((_Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_4b0,&local_1b0);
      std::
      _Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Tuple_impl((_Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_330,
                    (_Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_4b0);
      std::
      _Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Tuple_impl((_Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_4b0);
      testing::internal::
      PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>>>>
      ::operator()(&stack0xfffffffffffff940,local_330,
                   (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)"headers");
      std::
      _Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Tuple_impl((_Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_330);
      std::
      _Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Tuple_impl(&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578.second._M_dataplus._M_p != &local_578.second.field_2) {
        operator_delete(local_578.second._M_dataplus._M_p,
                        local_578.second.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578.first._M_dataplus._M_p != &local_578.first.field_2) {
        operator_delete(local_578.first._M_dataplus._M_p,
                        CONCAT71(local_578.first.field_2._M_allocated_capacity._1_7_,
                                 local_578.first.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8.second._M_dataplus._M_p != &local_5f8.second.field_2) {
        operator_delete(local_5f8.second._M_dataplus._M_p,
                        local_5f8.second.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8.first._M_dataplus._M_p != &local_5f8.first.field_2) {
        operator_delete(local_5f8.first._M_dataplus._M_p,
                        CONCAT71(local_5f8.first.field_2._M_allocated_capacity._1_7_,
                                 local_5f8.first.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8.second._M_dataplus._M_p != &local_5b8.second.field_2) {
        operator_delete(local_5b8.second._M_dataplus._M_p,
                        local_5b8.second.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8.first._M_dataplus._M_p != &local_5b8.first.field_2) {
        operator_delete(local_5b8.first._M_dataplus._M_p,
                        CONCAT71(local_5b8.first.field_2._M_allocated_capacity._1_7_,
                                 local_5b8.first.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518._32_8_ != &local_4e8) {
        operator_delete((void *)local_518._32_8_,local_4e8._M_allocated_capacity + 1);
      }
      if (local_518._0_8_ != (long)local_518 + 0x10) {
        operator_delete((void *)local_518._0_8_,local_518._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_638._32_8_ != &local_608) {
        operator_delete((void *)local_638._32_8_,
                        CONCAT71(local_608._M_allocated_capacity._1_7_,local_608._M_local_buf[0]) +
                        1);
      }
      if (local_638._0_8_ != (long)local_638 + 0x10) {
        operator_delete((void *)local_638._0_8_,local_638._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_698.uri_._M_dataplus._M_p != &local_698.uri_.field_2) {
        operator_delete(local_698.uri_._M_dataplus._M_p,
                        local_698.uri_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_698.method_._M_dataplus._M_p != &local_698.method_.field_2) {
        operator_delete(local_698.method_._M_dataplus._M_p,
                        local_698.method_.field_2._M_allocated_capacity + 1);
      }
      if (in_stack_fffffffffffff940 == '\0') {
        testing::Message::Message((Message *)local_4b0);
        if (local_6b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar14 = (local_6b8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_330,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_static_content.cpp"
                   ,0x8f,pcVar14);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_330,(Message *)local_4b0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_330);
        if ((long *)local_4b0._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_4b0._0_8_ + 8))();
        }
      }
      if (local_6b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_6b8,local_6b8);
      }
      pbVar12 = pstore::error_or<std::__cxx11::string>::
                value_storage_impl<pstore::error_or<std::__cxx11::string>const&,std::__cxx11::string_const>
                          (&local_4d8);
      ptVar13 = pstore::error_or<std::tuple<unsigned_long,int>>::
                value_storage_impl<pstore::error_or<std::tuple<unsigned_long,int>>const&,std::tuple<unsigned_long,int>const>
                          (&local_6b0);
      std::__cxx11::string::string
                ((string *)local_4b0,(string *)pbVar12,
                 (ptVar13->super__Tuple_impl<0UL,_unsigned_long,_int>).
                 super__Head_base<0UL,_unsigned_long,_false>._M_head_impl,(allocator *)&local_698);
      testing::internal::CmpHelperEQ<std::__cxx11::string,char[29]>
                ((internal *)local_330,"(std::string{*actual, pstore::get<0> (eo)})","index_html",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0,
                 (char (*) [29])"<!DOCTYPE html><html></html>");
      if ((undefined1 *)local_4b0._0_8_ != local_4b0 + 0x10) {
        operator_delete((void *)local_4b0._0_8_,local_4b0._16_8_ + 1);
      }
      if ((internal)local_330[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_4b0);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330._8_8_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar14 = "";
        }
        else {
          pcVar14 = *(char **)local_330._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_698,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_static_content.cpp"
                   ,0x90,pcVar14);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_698,(Message *)local_4b0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_698);
        if ((long *)local_4b0._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_4b0._0_8_ + 8))();
        }
      }
    }
    else {
      testing::Message::Message((Message *)&local_698);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_4b0,(internal *)local_330,
                 (AssertionResult *)"static_cast<bool> (eo)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_638,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_static_content.cpp"
                 ,0x89,(char *)local_4b0._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_638,(Message *)&local_698);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_638);
      if ((undefined1 *)local_4b0._0_8_ != local_4b0 + 0x10) {
        operator_delete((void *)local_4b0._0_8_,local_4b0._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_698.method_._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_698.method_._M_dataplus._M_p + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_330 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_330._8_8_);
    }
    if (local_6b0.has_error_ == false) {
      pstore::error_or<std::tuple<unsigned_long,int>>::
      value_storage_impl<pstore::error_or<std::tuple<unsigned_long,int>>&,std::tuple<unsigned_long,int>>
                (&local_6b0);
    }
    else {
      pstore::error_or<std::tuple<unsigned_long,int>>::
      error_storage_impl<pstore::error_or<std::tuple<unsigned_long,int>>&,std::error_code>
                (&local_6b0);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_538);
  }
  else {
    testing::Message::Message((Message *)&local_698);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_4b0,(internal *)local_330,
               (AssertionResult *)"static_cast<bool> (actual)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_638,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_static_content.cpp"
               ,0x73,(char *)local_4b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_638,(Message *)&local_698);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_638);
    if ((long *)local_4b0._0_8_ != plVar1) {
      operator_delete((void *)local_4b0._0_8_,local_4b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_698.method_._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_698.method_._M_dataplus._M_p + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_330 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_330._8_8_);
    }
  }
  pstore::error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~error_or(&local_4d8);
  return;
}

Assistant:

TEST_F (ServeStaticContent, Simple) {
    pstore::error_or<std::string> const actual = serve_path ("/index.html");
    ASSERT_TRUE (static_cast<bool> (actual));

    using string_pair = std::pair<std::string, std::string>;
    std::vector<string_pair> headers;

    reader r{*actual};
    auto const record_headers = [&r, &headers] (reader::state_type io,
                                                pstore::http::request_info const &) {
        auto record_header = [&headers] (int io2, std::string const & key,
                                         std::string const & value) {
            // The date value will change according to when the test is run so we preserve its
            // presence but drop its value.
            headers.emplace_back (key, (key == "date") ? "" : value);
            return io2 + 1;
        };

        return pstore::http::read_headers (r, io, record_header, 0);
    };

    pstore::error_or_n<std::string::size_type, int> const eo =
        pstore::http::read_request (r, std::string::size_type{0}) >>= record_headers;

    ASSERT_TRUE (static_cast<bool> (eo));
    EXPECT_THAT (headers,
                 ::testing::UnorderedElementsAre (
                     string_pair{"content-length", "28"}, string_pair{"content-type", "text/html"},
                     string_pair{"date", ""}, string_pair{"connection", "close"},
                     string_pair{"last-modified", "Tue, 23 Apr 2019 09:10:27 GMT"},
                     string_pair{"server", "pstore-http"}));
    EXPECT_EQ ((std::string{*actual, pstore::get<0> (eo)}), index_html);
}